

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontcombobox.cpp
# Opt level: O3

bool __thiscall QFontComboBox::event(QFontComboBox *this,QEvent *e)

{
  int iVar1;
  QWidgetData *pQVar2;
  int w;
  bool bVar3;
  QWidget *this_00;
  QWidget *this_01;
  QRect QVar4;
  
  if (*(short *)(e + 8) == 0xe) {
    QComboBox::view(&this->super_QComboBox);
    this_00 = (QWidget *)QMetaObject::cast((QObject *)&QListView::staticMetaObject);
    if (this_00 != (QWidget *)0x0) {
      this_01 = QWidget::window(this_00);
      pQVar2 = (this->super_QComboBox).super_QWidget.data;
      w = (((pQVar2->crect).x2.m_i - (pQVar2->crect).x1.m_i) * 5 + 5) / 3;
      QVar4 = QWidgetPrivate::availableScreenGeometry(this_00);
      iVar1 = (QVar4.x2.m_i.m_i - QVar4.x1.m_i) + 1;
      if (iVar1 <= w) {
        w = iVar1;
      }
      QWidget::setFixedWidth(this_01,w);
    }
  }
  bVar3 = QComboBox::event(&this->super_QComboBox,e);
  return bVar3;
}

Assistant:

bool QFontComboBox::event(QEvent *e)
{
    if (e->type() == QEvent::Resize) {
        QListView *lview = qobject_cast<QListView*>(view());
        if (lview) {
            lview->window()->setFixedWidth(qMin(width() * 5 / 3,
                                           QWidgetPrivate::availableScreenGeometry(lview).width()));
        }
    }
    return QComboBox::event(e);
}